

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderSetDoubleAttribute(ImfHeader *hdr,char *name,double value)

{
  undefined1 uVar1;
  TypedAttribute<double> *this;
  double *pdVar2;
  ImfHeader *in_RDI;
  double in_XMM0_Qa;
  char *in_stack_00000040;
  Header *in_stack_00000048;
  exception *e;
  Attribute *in_stack_00000520;
  char *in_stack_00000528;
  Header *in_stack_00000530;
  Header *in_stack_ffffffffffffff38;
  TypedAttribute<double> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  
  anon_unknown.dwarf_572a3::header(in_RDI);
  Imf_3_2::Header::find(in_stack_00000048,in_stack_00000040);
  Imf_3_2::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  anon_unknown.dwarf_572a3::header(in_RDI);
  Imf_3_2::Header::end(in_stack_ffffffffffffff38);
  Imf_3_2::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  uVar1 = Imf_3_2::operator==((ConstIterator *)in_stack_ffffffffffffff40,
                              (ConstIterator *)in_stack_ffffffffffffff38);
  if ((bool)uVar1) {
    anon_unknown.dwarf_572a3::header(in_RDI);
    Imf_3_2::TypedAttribute<double>::TypedAttribute
              (in_stack_ffffffffffffff40,(double *)in_stack_ffffffffffffff38);
    Imf_3_2::Header::insert(in_stack_00000530,in_stack_00000528,in_stack_00000520);
    Imf_3_2::TypedAttribute<double>::~TypedAttribute((TypedAttribute<double> *)0x18b711);
  }
  else {
    anon_unknown.dwarf_572a3::header(in_RDI);
    this = Imf_3_2::Header::typedAttribute<Imf_3_2::TypedAttribute<double>>
                     ((Header *)CONCAT17(uVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68)
    ;
    pdVar2 = Imf_3_2::TypedAttribute<double>::value(this);
    *pdVar2 = in_XMM0_Qa;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetDoubleAttribute (ImfHeader* hdr, const char name[], double value)
{
    try
    {
        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::DoubleAttribute (value));
        }
        else
        {
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::DoubleAttribute> (name)
                .value () = value;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}